

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O1

bool __thiscall
TorControlConnection::Connect
          (TorControlConnection *this,string *tor_control_center,ConnectionCB *_connected,
          ConnectionCB *_disconnected)

{
  long lVar1;
  DNSLookupFn dns_lookup_function;
  bool bVar2;
  int iVar3;
  bufferevent *pbVar4;
  char *fmt;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined1 auStack_118 [12];
  socklen_t control_address_len;
  _Any_data local_108;
  code *local_f8;
  sockaddr_storage control_address;
  optional<CService> control_service;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->b_conn != (bufferevent *)0x0) {
    bufferevent_free();
    this->b_conn = (bufferevent *)0x0;
  }
  bVar2 = fNameLookup;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_108,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._12_4_ = control_address_len;
  dns_lookup_function.super__Function_base._M_functor._0_12_ = auStack_118;
  dns_lookup_function._16_16_ = local_108;
  Lookup(&control_service,tor_control_center,0x235b,bVar2,dns_lookup_function);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (control_service.super__Optional_base<CService,_false,_false>._M_payload.
      super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
      _M_engaged == false) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "Connect";
    logging_function._M_len = 7;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0x99,ALL,Info,
               "tor: Failed to look up control center %s\n",tor_control_center);
  }
  else {
    control_address_len = 0x80;
    bVar2 = CService::GetSockAddr
                      ((CService *)&control_service,(sockaddr *)&control_address,
                       &control_address_len);
    if (bVar2) {
      pbVar4 = (bufferevent *)bufferevent_socket_new(this->base,0xffffffff,1);
      this->b_conn = pbVar4;
      if (pbVar4 == (bufferevent *)0x0) goto LAB_00ad49e6;
      bufferevent_setcb(pbVar4,readcb,0,eventcb,this);
      bufferevent_enable(this->b_conn,6);
      std::function<void_(TorControlConnection_&)>::operator=(&this->connected,_connected);
      std::function<void_(TorControlConnection_&)>::operator=(&this->disconnected,_disconnected);
      iVar3 = bufferevent_socket_connect(this->b_conn,&control_address,control_address_len);
      bVar2 = true;
      if (-1 < iVar3) goto LAB_00ad49e8;
      fmt = "tor: Error connecting to address %s\n";
      iVar3 = 0xb0;
    }
    else {
      fmt = "tor: Error parsing socket address %s\n";
      iVar3 = 0xa0;
    }
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "Connect";
    logging_function_00._M_len = 7;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,iVar3,ALL,Info,fmt,tor_control_center);
  }
LAB_00ad49e6:
  bVar2 = false;
LAB_00ad49e8:
  if ((control_service.super__Optional_base<CService,_false,_false>._M_payload.
       super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
       _M_engaged == true) &&
     (control_service.super__Optional_base<CService,_false,_false>._M_payload.
      super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
      _M_engaged = false,
     0x10 < control_service.super__Optional_base<CService,_false,_false>._M_payload.
            super__Optional_payload<CService,_true,_false,_false>.
            super__Optional_payload_base<CService>._M_payload._M_value.super_CNetAddr.m_addr._size))
  {
    free((void *)control_service.super__Optional_base<CService,_false,_false>._M_payload.
                 super__Optional_payload<CService,_true,_false,_false>.
                 super__Optional_payload_base<CService>._M_payload._0_8_);
    control_service.super__Optional_base<CService,_false,_false>._M_payload.
    super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
    _M_payload._0_8_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool TorControlConnection::Connect(const std::string& tor_control_center, const ConnectionCB& _connected, const ConnectionCB& _disconnected)
{
    if (b_conn) {
        Disconnect();
    }

    const std::optional<CService> control_service{Lookup(tor_control_center, DEFAULT_TOR_CONTROL_PORT, fNameLookup)};
    if (!control_service.has_value()) {
        LogPrintf("tor: Failed to look up control center %s\n", tor_control_center);
        return false;
    }

    struct sockaddr_storage control_address;
    socklen_t control_address_len = sizeof(control_address);
    if (!control_service.value().GetSockAddr(reinterpret_cast<struct sockaddr*>(&control_address), &control_address_len)) {
        LogPrintf("tor: Error parsing socket address %s\n", tor_control_center);
        return false;
    }

    // Create a new socket, set up callbacks and enable notification bits
    b_conn = bufferevent_socket_new(base, -1, BEV_OPT_CLOSE_ON_FREE);
    if (!b_conn) {
        return false;
    }
    bufferevent_setcb(b_conn, TorControlConnection::readcb, nullptr, TorControlConnection::eventcb, this);
    bufferevent_enable(b_conn, EV_READ|EV_WRITE);
    this->connected = _connected;
    this->disconnected = _disconnected;

    // Finally, connect to tor_control_center
    if (bufferevent_socket_connect(b_conn, reinterpret_cast<struct sockaddr*>(&control_address), control_address_len) < 0) {
        LogPrintf("tor: Error connecting to address %s\n", tor_control_center);
        return false;
    }
    return true;
}